

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_token.c
# Opt level: O1

char * token_name(gtoken_t token)

{
  if (token < (TOK_OP_CLOSED_SQUAREBRACKET|TOK_NUMBER)) {
    return &DAT_00145738 + *(int *)(&DAT_00145738 + (ulong)token * 4);
  }
  return "UNRECOGNIZED TOKEN";
}

Assistant:

const char *token_name (gtoken_t token) {
    switch (token) {
        case TOK_EOF: return "EOF";
        case TOK_ERROR: return "ERROR";
        case TOK_COMMENT: return "COMMENT";
        case TOK_STRING: return "STRING";
        case TOK_NUMBER: return "NUMBER";
        case TOK_IDENTIFIER: return "IDENTIFIER";
        case TOK_SPECIAL: return "SPECIAL";
        case TOK_MACRO: return "MACRO";

        // keywords
        case TOK_KEY_FILE: return "file";
        case TOK_KEY_FUNC: return "func";
        case TOK_KEY_SUPER: return "super";
        case TOK_KEY_DEFAULT: return "default";
        case TOK_KEY_TRUE: return "true";
        case TOK_KEY_FALSE: return "false";
        case TOK_KEY_IF: return "if";
        case TOK_KEY_ELSE: return "else";
        case TOK_KEY_SWITCH: return "switch";
        case TOK_KEY_BREAK: return "break";
        case TOK_KEY_CONTINUE: return "continue";
        case TOK_KEY_RETURN: return "return";
        case TOK_KEY_WHILE: return "while";
        case TOK_KEY_REPEAT: return "repeat";
        case TOK_KEY_FOR: return "for";
        case TOK_KEY_IN: return "in";
        case TOK_KEY_ENUM: return "enum";
        case TOK_KEY_CLASS: return "class";
        case TOK_KEY_STRUCT: return "struct";
        case TOK_KEY_PRIVATE: return "private";
        case TOK_KEY_INTERNAL: return "internal";
        case TOK_KEY_PUBLIC: return "public";
        case TOK_KEY_STATIC: return "static";
        case TOK_KEY_EXTERN: return "extern";
        case TOK_KEY_LAZY: return "lazy";
        case TOK_KEY_CONST: return "const";
        case TOK_KEY_VAR: return "var";
        case TOK_KEY_MODULE: return "module";
        case TOK_KEY_IMPORT: return "import";
        case TOK_KEY_CASE: return "case";
        case TOK_KEY_EVENT: return "event";
        case TOK_KEY_NULL: return "null";
        case TOK_KEY_UNDEFINED: return "undefined";
        case TOK_KEY_ISA: return "is";
        case TOK_KEY_CURRARGS: return "_args";
        case TOK_KEY_CURRFUNC: return "_func";

        // operators
        case TOK_OP_ADD: return "+";
        case TOK_OP_SUB: return "-";
        case TOK_OP_DIV: return "/";
        case TOK_OP_MUL: return "*";
        case TOK_OP_REM: return "%";
        case TOK_OP_ASSIGN: return "=";
        case TOK_OP_LESS: return "<";
        case TOK_OP_GREATER: return ">";
        case TOK_OP_LESS_EQUAL: return "<=";
        case TOK_OP_GREATER_EQUAL: return ">=";
        case TOK_OP_ADD_ASSIGN: return "+=";
        case TOK_OP_SUB_ASSIGN: return "-=";
        case TOK_OP_DIV_ASSIGN: return "/=";
        case TOK_OP_MUL_ASSIGN: return "*=";
        case TOK_OP_REM_ASSIGN: return "%=";
        case TOK_OP_NOT: return "!";
        case TOK_OP_AND: return "&&";
        case TOK_OP_OR: return "||";
        case TOK_OP_ISEQUAL: return "==";
        case TOK_OP_ISNOTEQUAL: return "!=";
        case TOK_OP_RANGE_INCLUDED: return "...";
        case TOK_OP_RANGE_EXCLUDED: return "..<";
        case TOK_OP_TERNARY: return "?";
        case TOK_OP_SHIFT_LEFT: return "<<";
        case TOK_OP_SHIFT_RIGHT: return ">>";
        case TOK_OP_BIT_AND: return "&";
        case TOK_OP_BIT_OR: return "|";
        case TOK_OP_BIT_XOR: return "^";
        case TOK_OP_BIT_NOT: return "~";
        case TOK_OP_ISIDENTICAL: return "===";
        case TOK_OP_ISNOTIDENTICAL: return "!==";
        case TOK_OP_PATTERN_MATCH: return "~=";
        case TOK_OP_SHIFT_LEFT_ASSIGN: return "<<=";
        case TOK_OP_SHIFT_RIGHT_ASSIGN: return ">>=";
        case TOK_OP_BIT_AND_ASSIGN: return "&=";
        case TOK_OP_BIT_OR_ASSIGN: return "|=";
        case TOK_OP_BIT_XOR_ASSIGN: return "^=";

        case TOK_OP_OPEN_PARENTHESIS: return "(";
        case TOK_OP_CLOSED_PARENTHESIS: return ")";
        case TOK_OP_OPEN_SQUAREBRACKET: return "[";
        case TOK_OP_CLOSED_SQUAREBRACKET: return "]";
        case TOK_OP_OPEN_CURLYBRACE: return "{";
        case TOK_OP_CLOSED_CURLYBRACE: return "}";
        case TOK_OP_SEMICOLON: return ";";
        case TOK_OP_COLON: return ":";
        case TOK_OP_COMMA: return ",";
        case TOK_OP_DOT: return ".";

        case TOK_END: return "";
    }

    // should never reach this point
    return "UNRECOGNIZED TOKEN";
}